

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digraph.hxx
# Opt level: O2

size_t __thiscall
andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::insertVertices
          (Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *this,size_t number)

{
  pointer pVVar1;
  const_iterator __position;
  value_type local_58;
  
  pVVar1 = (this->vertices_).
           super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->vertices_).
       super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_58.from_.vector_.
  super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.from_.vector_.
  super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.from_.vector_.
  super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.to_.vector_.
  super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.to_.vector_.
  super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.to_.vector_.
  super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
  ::insert(&this->vertices_,__position,number,&local_58);
  Vertex::~Vertex(&local_58);
  return (long)__position._M_current - (long)pVVar1 >> 6;
}

Assistant:

inline std::size_t
Digraph<VISITOR>::insertVertices(
    const std::size_t number
) {
    std::size_t position = vertices_.size();
    vertices_.insert(vertices_.end(), number, Vertex());
    visitor_.insertVertices(position, number);
    return position;
}